

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O1

void __thiscall OpenMD::SimInfo::setupSimVariables(SimInfo *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  Globals *pGVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  _Base_ptr p_Var12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  local_90;
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  local_60;
  
  pGVar3 = this->simParams_;
  this->useAtomicVirial_ = (bool)(pGVar3->UseAtomicVirial).super_ParameterBase.field_0x2b;
  this->calcBoxDipole_ = false;
  if (((pGVar3->AccumulateBoxDipole).super_ParameterBase.empty_ == false) &&
     ((pGVar3->AccumulateBoxDipole).super_ParameterBase.field_0x2b == '\x01')) {
    this->calcBoxDipole_ = true;
  }
  this->calcBoxQuadrupole_ = false;
  if (((pGVar3->AccumulateBoxQuadrupole).super_ParameterBase.empty_ == false) &&
     ((pGVar3->AccumulateBoxQuadrupole).super_ParameterBase.field_0x2b == '\x01')) {
    this->calcBoxQuadrupole_ = true;
  }
  p_Var1 = &local_90._M_impl.super__Rb_tree_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  getSimulatedAtomTypes((AtomTypeSet *)&local_60,this);
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::clear(&local_90);
  if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var2 = &local_60._M_impl.super__Rb_tree_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_color =
         local_60._M_impl.super__Rb_tree_header._M_header._M_color;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_90._M_impl.super__Rb_tree_header._M_header._M_left =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    local_90._M_impl.super__Rb_tree_header._M_node_count =
         local_60._M_impl.super__Rb_tree_header._M_node_count;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  }
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::~_Rb_tree(&local_60);
  if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left == p_Var1) {
    bVar8 = false;
    bVar9 = false;
    bVar10 = false;
    bVar11 = false;
  }
  else {
    p_Var12 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar4 = 0;
    bVar5 = 0;
    bVar6 = 0;
    bVar7 = 0;
    do {
      bVar15 = bVar7;
      bVar13 = bVar6;
      bVar14 = bVar5;
      bVar16 = bVar4;
      bVar8 = AtomType::isElectrostatic(*(AtomType **)(p_Var12 + 1));
      bVar9 = AtomType::isMetal(*(AtomType **)(p_Var12 + 1));
      bVar10 = AtomType::isDirectional(*(AtomType **)(p_Var12 + 1));
      bVar11 = AtomType::isFluctuatingCharge(*(AtomType **)(p_Var12 + 1));
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      bVar4 = bVar16 | bVar11;
      bVar5 = bVar14 | bVar8;
      bVar6 = bVar13 | bVar9;
      bVar7 = bVar15 | bVar10;
    } while ((_Rb_tree_header *)p_Var12 != &local_90._M_impl.super__Rb_tree_header);
    bVar10 = (bool)(bVar15 | bVar10);
    bVar9 = (bool)(bVar13 | bVar9);
    bVar8 = (bool)(bVar14 | bVar8);
    bVar11 = (bool)(bVar16 | bVar11);
  }
  this->usesDirectionalAtoms_ = bVar10;
  this->usesMetallicAtoms_ = bVar9;
  this->usesElectrostaticAtoms_ = bVar8;
  this->usesFluctuatingCharges_ = bVar11;
  this->requiresPrepair_ = bVar9;
  this->requiresSkipCorrection_ = bVar8;
  this->requiresSelfCorrection_ = bVar8;
  std::
  _Rb_tree<OpenMD::AtomType_*,_OpenMD::AtomType_*,_std::_Identity<OpenMD::AtomType_*>,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  ::~_Rb_tree(&local_90);
  return;
}

Assistant:

void SimInfo::setupSimVariables() {
    useAtomicVirial_ = simParams_->getUseAtomicVirial();
    // we only call setAccumulateBoxDipole if the accumulateBoxDipole
    // parameter is true
    calcBoxDipole_ = false;
    if (simParams_->haveAccumulateBoxDipole())
      if (simParams_->getAccumulateBoxDipole()) { calcBoxDipole_ = true; }
    // we only call setAccumulateBoxQuadrupole if the accumulateBoxQuadrupole
    // parameter is true
    calcBoxQuadrupole_ = false;
    if (simParams_->haveAccumulateBoxQuadrupole())
      if (simParams_->getAccumulateBoxQuadrupole()) {
        calcBoxQuadrupole_ = true;
      }

    AtomTypeSet::iterator i;
    AtomTypeSet atomTypes;
    atomTypes                   = getSimulatedAtomTypes();
    bool usesElectrostatic      = false;
    bool usesMetallic           = false;
    bool usesDirectional        = false;
    bool usesFluctuatingCharges = false;
    // loop over all of the atom types
    for (i = atomTypes.begin(); i != atomTypes.end(); ++i) {
      usesElectrostatic |= (*i)->isElectrostatic();
      usesMetallic |= (*i)->isMetal();
      usesDirectional |= (*i)->isDirectional();
      usesFluctuatingCharges |= (*i)->isFluctuatingCharge();
    }

#ifdef IS_MPI
    int temp;

    temp = usesDirectional;
    MPI_Allreduce(MPI_IN_PLACE, &temp, 1, MPI_INT, MPI_LOR, MPI_COMM_WORLD);
    usesDirectionalAtoms_ = (temp == 0) ? false : true;

    temp = usesMetallic;
    MPI_Allreduce(MPI_IN_PLACE, &temp, 1, MPI_INT, MPI_LOR, MPI_COMM_WORLD);
    usesMetallicAtoms_ = (temp == 0) ? false : true;

    temp = usesElectrostatic;
    MPI_Allreduce(MPI_IN_PLACE, &temp, 1, MPI_INT, MPI_LOR, MPI_COMM_WORLD);
    usesElectrostaticAtoms_ = (temp == 0) ? false : true;

    temp = usesFluctuatingCharges;
    MPI_Allreduce(MPI_IN_PLACE, &temp, 1, MPI_INT, MPI_LOR, MPI_COMM_WORLD);
    usesFluctuatingCharges_ = (temp == 0) ? false : true;
#else

    usesDirectionalAtoms_   = usesDirectional;
    usesMetallicAtoms_      = usesMetallic;
    usesElectrostaticAtoms_ = usesElectrostatic;
    usesFluctuatingCharges_ = usesFluctuatingCharges;

#endif

    requiresPrepair_        = usesMetallicAtoms_ ? true : false;
    requiresSkipCorrection_ = usesElectrostaticAtoms_ ? true : false;
    requiresSelfCorrection_ = usesElectrostaticAtoms_ ? true : false;
  }